

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O1

void __thiscall TestRegistry::listTestGroupNames(TestRegistry *this,TestResult *result)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  SimpleString gname;
  SimpleString groupList;
  SimpleString SStack_68;
  SimpleString local_58;
  TestResult *local_48;
  UtestShell *pUVar3;
  
  local_48 = result;
  SimpleString::SimpleString(&local_58,"");
  pUVar3 = this->tests_;
  while (pUVar3 != (UtestShell *)0x0) {
    SimpleString::SimpleString(&SStack_68,"");
    SimpleString::operator+=(&SStack_68,"#");
    UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffc0);
    SimpleString::operator+=(&SStack_68,(SimpleString *)&stack0xffffffffffffffc0);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
    SimpleString::operator+=(&SStack_68,"#");
    bVar1 = SimpleString::contains(&local_58,&SStack_68);
    if (!bVar1) {
      SimpleString::operator+=(&local_58,&SStack_68);
      SimpleString::operator+=(&local_58," ");
    }
    SimpleString::~SimpleString(&SStack_68);
    iVar2 = (*pUVar3->_vptr_UtestShell[3])(pUVar3);
    pUVar3 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  SimpleString::replace(&local_58,"#","");
  SimpleString::SimpleString(&SStack_68," ");
  bVar1 = SimpleString::endsWith(&local_58,&SStack_68);
  SimpleString::~SimpleString(&SStack_68);
  if (bVar1) {
    SimpleString::size(&local_58);
    SimpleString::subString(&SStack_68,(size_t)&local_58,0);
    SimpleString::operator=(&local_58,&SStack_68);
    SimpleString::~SimpleString(&SStack_68);
  }
  pcVar4 = SimpleString::asCharString(&local_58);
  (*local_48->_vptr_TestResult[0xe])(local_48,pcVar4);
  SimpleString::~SimpleString(&local_58);
  return;
}

Assistant:

void TestRegistry::listTestGroupNames(TestResult& result)
{
    SimpleString groupList;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
        SimpleString gname;
        gname += "#";
        gname += test->getGroup();
        gname += "#";

        if (!groupList.contains(gname)) {
            groupList += gname;
            groupList += " ";
        }
    }

    groupList.replace("#", "");

    if (groupList.endsWith(" "))
        groupList = groupList.subString(0, groupList.size() - 1);
    result.print(groupList.asCharString());
}